

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::SEES_PDU::Decode(SEES_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  undefined1 local_80 [8];
  VectoringNozzleSystem vns;
  undefined1 local_68 [6];
  KUINT16 i_1;
  PropulsionSystem ps;
  KUINT16 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  SEES_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x1c) {
    ps.m_f32PowerSetting._3_1_ = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    ps.m_f32PowerSetting._3_1_ = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_OriginatingEntity);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16IrSigRepIndex);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16AcousticSigRepIndex);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16CrossSection);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16NumPropulsionSys);
  KDataStream::operator>>(pKVar2,&this->m_ui16NumVectoringNozzleSys);
  std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ::clear(&this->m_vPropSys);
  std::
  vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ::clear(&this->m_vVecNozzleSys);
  for (ps.m_f32PowerSetting._0_2_ = 0; ps.m_f32PowerSetting._0_2_ < this->m_ui16NumPropulsionSys;
      ps.m_f32PowerSetting._0_2_ = ps.m_f32PowerSetting._0_2_ + 1) {
    DATA_TYPE::PropulsionSystem::PropulsionSystem((PropulsionSystem *)local_68);
    DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)local_68);
    std::
    vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>::
    push_back(&this->m_vPropSys,(value_type *)local_68);
    DATA_TYPE::PropulsionSystem::~PropulsionSystem((PropulsionSystem *)local_68);
  }
  for (vns.m_f32VDeflAngle._2_2_ = 0; vns.m_f32VDeflAngle._2_2_ < this->m_ui16NumVectoringNozzleSys;
      vns.m_f32VDeflAngle._2_2_ = vns.m_f32VDeflAngle._2_2_ + 1) {
    DATA_TYPE::VectoringNozzleSystem::VectoringNozzleSystem((VectoringNozzleSystem *)local_80);
    DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)local_80);
    std::
    vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
    ::push_back(&this->m_vVecNozzleSys,(value_type *)local_80);
    DATA_TYPE::VectoringNozzleSystem::~VectoringNozzleSystem((VectoringNozzleSystem *)local_80);
  }
  return;
}

Assistant:

void SEES_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SEES_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_OriginatingEntity
           >> m_ui16IrSigRepIndex
           >> m_ui16AcousticSigRepIndex
           >> m_ui16CrossSection
           >> m_ui16NumPropulsionSys
           >> m_ui16NumVectoringNozzleSys;

    m_vPropSys.clear();
    m_vVecNozzleSys.clear();

    for( KUINT16 i = 0; i < m_ui16NumPropulsionSys; ++i )
    {
        PropulsionSystem ps;
        stream >> KDIS_STREAM ps;
        m_vPropSys.push_back( ps );
    }

    for( KUINT16 i = 0; i < m_ui16NumVectoringNozzleSys; ++i )
    {
        VectoringNozzleSystem vns;
        stream >> KDIS_STREAM vns;
        m_vVecNozzleSys.push_back( vns );
    }
}